

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  long lVar1;
  DILogger local_330;
  int local_1b0;
  int i;
  undefined4 local_19c;
  undefined1 local_198 [4];
  int buffNum;
  DIResult result;
  CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)local_198);
  local_19c = 10;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             10,this->_buffers);
  for (local_1b0 = 0; local_1b0 < 10; local_1b0 = local_1b0 + 1) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_buffers[local_1b0]);
    lVar1 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,this->_buffers[local_1b0]);
    DIResult::sub_result(&local_330,(DIResult *)local_198,lVar1);
    DILogger::~DILogger(&local_330);
  }
  lVar1 = DIResult::code((DIResult *)local_198);
  DIResult::~DIResult((DIResult *)local_198);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		const int buffNum = sizeof(_buffers) / sizeof(_buffers[0]);

		glGenBuffers(buffNum, _buffers);

		for (int i = 0; i < buffNum; ++i)
		{
			glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[i]);
			result.sub_result(BindingPointCheck<api>(_buffers[i]));
		}

		return result.code();
	}